

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

boolean breakarm(permonst *ptr)

{
  byte bVar1;
  
  bVar1 = ptr->msize;
  if (bVar1 < 3) {
    if (bVar1 == 2) {
      if (ptr != mons + 0x2b && (ptr != mons + 0x133 && (ptr->mflags1 & 0x20000) != 0)) {
        return '\0';
      }
    }
    else if (ptr != mons + 0x2b && ptr != mons + 0x133) {
      return '\0';
    }
  }
  return ptr->mlet != '6' && ((1 < bVar1 && ptr->mlet != '\x16') && ptr != mons + 0x9f);
}

Assistant:

boolean breakarm(const struct permonst *ptr)
{
	return ((bigmonst(ptr) || (ptr->msize > MZ_SMALL && !humanoid(ptr)) ||
		/* special cases of humanoids that cannot wear body armor */
		ptr == &mons[PM_MARILITH] || ptr == &mons[PM_WINGED_GARGOYLE])
	      && !sliparm(ptr));
}